

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

void rr::resolveMultisampleDepthBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  int iVar1;
  int iVar2;
  ConstPixelBufferAccess *baseAccess;
  float fVar3;
  int local_cc;
  float local_c8;
  int s;
  float sum;
  int x;
  int y;
  float numSamplesInv;
  ConstPixelBufferAccess local_90;
  undefined1 local_68 [8];
  PixelBufferAccess effectiveDst;
  ConstPixelBufferAccess effectiveSrc;
  MultisampleConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  baseAccess = MultisampleConstPixelBufferAccess::raw(src);
  tcu::getEffectiveDepthStencilAccess
            ((ConstPixelBufferAccess *)&effectiveDst.super_ConstPixelBufferAccess.m_data,baseAccess,
             MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)local_68,dst,MODE_DEPTH);
  iVar1 = MultisampleConstPixelBufferAccess::getNumSamples(src);
  if (iVar1 == 1) {
    MultisampleConstPixelBufferAccess::fromMultisampleAccess
              ((MultisampleConstPixelBufferAccess *)&y,
               (ConstPixelBufferAccess *)&effectiveDst.super_ConstPixelBufferAccess.m_data);
    MultisampleConstPixelBufferAccess::toSinglesampleAccess
              (&local_90,(MultisampleConstPixelBufferAccess *)&y);
    tcu::copy((EVP_PKEY_CTX *)local_68,(EVP_PKEY_CTX *)&local_90);
  }
  else {
    iVar1 = MultisampleConstPixelBufferAccess::getNumSamples(src);
    for (sum = 0.0;
        iVar2 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess),
        (int)sum < iVar2; sum = (float)((int)sum + 1)) {
      for (s = 0; iVar2 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess),
          s < iVar2; s = s + 1) {
        local_c8 = 0.0;
        for (local_cc = 0; iVar2 = MultisampleConstPixelBufferAccess::getNumSamples(src),
            local_cc < iVar2; local_cc = local_cc + 1) {
          fVar3 = tcu::ConstPixelBufferAccess::getPixDepth
                            ((ConstPixelBufferAccess *)
                             &effectiveDst.super_ConstPixelBufferAccess.m_data,local_cc,s,(int)sum);
          local_c8 = fVar3 + local_c8;
        }
        tcu::PixelBufferAccess::setPixDepth
                  ((PixelBufferAccess *)local_68,local_c8 * (1.0 / (float)iVar1),s,(int)sum,0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleDepthBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	const tcu::ConstPixelBufferAccess	effectiveSrc = tcu::getEffectiveDepthStencilAccess(src.raw(), tcu::Sampler::MODE_DEPTH);
	const tcu::PixelBufferAccess		effectiveDst = tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_DEPTH);

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(effectiveDst, MultisampleConstPixelBufferAccess::fromMultisampleAccess(effectiveSrc).toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			float sum = 0.0f;
			for (int s = 0; s < src.getNumSamples(); s++)
				sum += effectiveSrc.getPixDepth(s, x, y);

			effectiveDst.setPixDepth(sum*numSamplesInv, x, y);
		}
	}
}